

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_new.c
# Opt level: O3

LY_ERR lyd_new_list3(lyd_node *parent,lys_module *module,char *name,char **key_values,
                    uint32_t *value_lengths,uint32_t options,lyd_node **node)

{
  lyd_node *parent_00;
  LY_ERR LVar1;
  uint uVar2;
  lys_module *plVar3;
  lysc_node *plVar4;
  ly_ctx *ctx;
  char *pcVar6;
  ly_ctx *ctx_00;
  ulong uVar7;
  LY_VALUE_FORMAT format;
  char **local_50;
  uint32_t *local_48;
  lyd_node *local_40;
  lyd_node *key;
  size_t sVar5;
  
  local_40 = (lyd_node *)0x0;
  if (parent == (lyd_node *)0x0) {
    plVar3 = module;
    if (module != (lys_module *)0x0) goto LAB_0012bdc9;
    ctx_00 = (ly_ctx *)0x0;
  }
  else {
    if (parent->schema == (lysc_node *)0x0) {
      plVar3 = (lys_module *)&parent[2].schema;
    }
    else {
      plVar3 = parent->schema->module;
    }
LAB_0012bdc9:
    ctx_00 = plVar3->ctx;
  }
  local_50 = key_values;
  local_48 = value_lengths;
  LVar1 = lyd_new_val_get_format(options,&format);
  if (LVar1 != LY_SUCCESS) {
    return LVar1;
  }
  if (parent == (lyd_node *)0x0 && module == (lys_module *)0x0) {
    pcVar6 = "parent || module";
  }
  else if (parent == (lyd_node *)0x0 && node == (lyd_node **)0x0) {
    pcVar6 = "parent || node";
  }
  else if (name == (char *)0x0) {
    pcVar6 = "name";
  }
  else if (local_48 == (uint32_t *)0x0 && format == LY_VALUE_LYB) {
    pcVar6 = "(format != LY_VALUE_LYB) || value_lengths";
  }
  else {
    if (parent != (lyd_node *)0x0) {
      if (parent->schema == (lysc_node *)0x0) {
        ctx = (ly_ctx *)parent[2].schema;
        if ((ctx != (ly_ctx *)0x0 && module != (lys_module *)0x0) &&
           (ctx != module->ctx && module->ctx != (ly_ctx *)0x0)) goto LAB_0012bf74;
      }
      else if ((module != (lys_module *)0x0) &&
              (((ctx = parent->schema->module->ctx, ctx != (ly_ctx *)0x0 &&
                (module->ctx != (ly_ctx *)0x0)) && (ctx != module->ctx)))) {
LAB_0012bf74:
        ly_log(ctx,LY_LLERR,LY_EINVAL,"Different contexts mixed in a single function call.");
        return LY_EINVAL;
      }
    }
    if (((options >> 1 & 1) == 0) || ((format != LY_VALUE_LYB && (format != LY_VALUE_CANON)))) {
      LVar1 = _lyd_new_list_node(ctx_00,parent,module,name,options,&local_40);
      parent_00 = local_40;
      if (LVar1 != LY_SUCCESS) {
        return LVar1;
      }
      plVar4 = local_40->schema;
      if ((local_50 == (char **)0x0) && ((plVar4->flags & 0x200) == 0)) {
        LVar1 = LY_EINVAL;
        ly_log(ctx_00,LY_LLERR,LY_EINVAL,"Missing list \"%s\" keys.",plVar4->name);
LAB_0012bf6a:
        lyd_free_tree(parent_00);
        return LVar1;
      }
      plVar4 = lysc_node_child(plVar4);
      if (plVar4 != (lysc_node *)0x0) {
        uVar7 = 0;
        do {
          if ((plVar4->flags & 0x100) == 0) break;
          pcVar6 = local_50[uVar7];
          if (pcVar6 == (char *)0x0) {
            pcVar6 = "";
          }
          if (local_48 == (uint32_t *)0x0) {
            sVar5 = strlen(pcVar6);
            uVar2 = (uint)sVar5;
          }
          else {
            uVar2 = local_48[uVar7];
          }
          LVar1 = lyd_create_term(plVar4,pcVar6,(ulong)uVar2,'\0',(byte)(options >> 1) & 1,
                                  (ly_bool *)0x0,format,(void *)0x0,0x3f3,(ly_bool *)0x0,&key);
          if (LVar1 != LY_SUCCESS) goto LAB_0012bf6a;
          lyd_insert_node(parent_00,(lyd_node **)0x0,key,1);
          uVar7 = (ulong)((int)uVar7 + 1);
          plVar4 = plVar4->next;
        } while (plVar4 != (lysc_node *)0x0);
      }
      if (parent != (lyd_node *)0x0) {
        lyd_insert_node(parent,(lyd_node **)0x0,parent_00,0);
      }
      if (node == (lyd_node **)0x0) {
        return LY_SUCCESS;
      }
      *node = parent_00;
      return LY_SUCCESS;
    }
    pcVar6 = "!(store_only && (format == LY_VALUE_CANON || format == LY_VALUE_LYB))";
  }
  ly_log(ctx_00,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).",pcVar6,"lyd_new_list3");
  return LY_EINVAL;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyd_new_list3(struct lyd_node *parent, const struct lys_module *module, const char *name, const char **key_values,
        uint32_t *value_lengths, uint32_t options, struct lyd_node **node)
{
    struct lyd_node *ret = NULL, *key;
    const struct lysc_node *key_s;
    const struct ly_ctx *ctx = parent ? LYD_CTX(parent) : (module ? module->ctx : NULL);
    const void *key_val;
    uint32_t key_len, i;
    LY_ERR rc = LY_SUCCESS;
    ly_bool store_only = (options & LYD_NEW_VAL_STORE_ONLY) ? 1 : 0;
    LY_VALUE_FORMAT format;

    LY_CHECK_RET(lyd_new_val_get_format(options, &format));
    LY_CHECK_ARG_RET(ctx, parent || module, parent || node, name, (format != LY_VALUE_LYB) || value_lengths, LY_EINVAL);
    LY_CHECK_CTX_EQUAL_RET(parent ? LYD_CTX(parent) : NULL, module ? module->ctx : NULL, LY_EINVAL);
    LY_CHECK_ARG_RET(ctx, !(store_only && (format == LY_VALUE_CANON || format == LY_VALUE_LYB)), LY_EINVAL);

    /* create the list node */
    LY_CHECK_RET(_lyd_new_list_node(ctx, parent, module, name, options, &ret));

    if (!(ret->schema->flags & LYS_KEYLESS) && !key_values) {
        LOGERR(ctx, LY_EINVAL, "Missing list \"%s\" keys.", LYD_NAME(ret));
        rc = LY_EINVAL;
        goto cleanup;
    }

    /* create and insert all the keys */
    i = 0;
    for (key_s = lysc_node_child(ret->schema); key_s && (key_s->flags & LYS_KEY); key_s = key_s->next) {
        key_val = key_values[i] ? key_values[i] : "";
        key_len = value_lengths ? value_lengths[i] : strlen(key_val);

        rc = lyd_create_term(key_s, key_val, key_len, 0, store_only, NULL, format, NULL, LYD_HINT_DATA, NULL, &key);
        LY_CHECK_GOTO(rc, cleanup);
        lyd_insert_node(ret, NULL, key, LYD_INSERT_NODE_LAST);
        ++i;
    }

    if (parent) {
        lyd_insert_node(parent, NULL, ret, LYD_INSERT_NODE_DEFAULT);
    }

cleanup:
    if (rc) {
        lyd_free_tree(ret);
        ret = NULL;
    } else if (node) {
        *node = ret;
    }
    return rc;
}